

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_vector.cpp
# Opt level: O0

void use_vector(void)

{
  void *this;
  ostream *poVar1;
  double dVar2;
  __type _Var3;
  Vector local_e0;
  Vector local_c0;
  undefined1 local_a0 [8];
  Vector v4;
  Vector v3;
  Vector v2;
  undefined1 local_30 [8];
  Vector v1;
  double PI;
  
  dVar2 = atan(1.0);
  v1._radius = dVar2 * 4.0;
  this = (void *)std::ostream::operator<<(&std::cout,v1._radius);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  L11_2::Vector::Vector((Vector *)local_30,3.0,4.0,RECT);
  std::operator<<((ostream *)&std::cout,"v1: ");
  L11_2::Vector::show((Vector *)local_30,RECT);
  L11_2::Vector::show((Vector *)local_30,POL);
  L11_2::Vector::Vector((Vector *)&v3._radius,5.0,5.0,RECT);
  std::operator<<((ostream *)&std::cout,"v2: ");
  L11_2::Vector::show((Vector *)&v3._radius,RECT);
  L11_2::Vector::show((Vector *)&v3._radius,POL);
  _Var3 = std::sqrt<int>(2);
  L11_2::Vector::Vector((Vector *)&v4._radius,_Var3 * 5.0,v1._radius * 0.25,POL);
  std::operator<<((ostream *)&std::cout,"v3: ");
  L11_2::Vector::show((Vector *)&v4._radius,RECT);
  L11_2::Vector::show((Vector *)&v4._radius,POL);
  L11_2::Vector::operator+((Vector *)local_a0,(Vector *)&v4._radius,(Vector *)&v3._radius);
  L11_2::Vector::show((Vector *)local_a0,RECT);
  L11_2::operator*(&local_c0,5.0,(Vector *)local_a0);
  L11_2::Vector::show(&local_c0,RECT);
  L11_2::Vector::~Vector(&local_c0);
  L11_2::Vector::Vector(&local_e0,100.0,20.0,RECT);
  poVar1 = L11_2::operator<<((ostream *)&std::cout,&local_e0);
  std::operator<<(poVar1,"\n");
  L11_2::Vector::~Vector(&local_e0);
  L11_2::Vector::~Vector((Vector *)local_a0);
  L11_2::Vector::~Vector((Vector *)&v4._radius);
  L11_2::Vector::~Vector((Vector *)&v3._radius);
  L11_2::Vector::~Vector((Vector *)local_30);
  return;
}

Assistant:

void use_vector() {
    using namespace L11_2;

    const double PI = 4 * std::atan(1.);

    std::cout << PI << std::endl;
    Vector v1(3, 4);
    std::cout << "v1: ";
    v1.show();
    v1.show(Vector::POL);

    Vector v2(5, 5);
    std::cout << "v2: ";
    v2.show();
    v2.show(Vector::POL);

    Vector v3(5 * std::sqrt(2), PI / 4, Vector::MODE::POL);
    std::cout << "v3: ";
    v3.show();
    v3.show(Vector::POL);

    Vector v4 = v3 + v2;
    v4.show();

    (5 * v4).show();

    std::cout << Vector(100, 20) << "\n";
}